

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi)

{
  int *piVar1;
  TileDataEnc *pTVar2;
  EncWorkerData *pEVar3;
  void *__dest;
  AVxWorker *pAVar4;
  macroblock *mb;
  AVxWorkerInterface *pAVar5;
  byte bVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  AVxWorker *pAVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  AV1_COMMON *cm;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar11 = (cpi->common).tiles.cols;
  iVar12 = (cpi->common).tiles.rows;
  lVar18 = (long)iVar12;
  if (lVar18 < 1) {
    uVar10 = 0;
  }
  else {
    iVar9 = (cpi->common).mi_params.mi_rows;
    lVar15 = 0;
    uVar10 = 0;
    do {
      piVar1 = (cpi->common).tiles.row_start_sb + lVar15;
      bVar6 = (byte)((cpi->common).seq_params)->mib_size_log2;
      iVar16 = (cpi->common).tiles.row_start_sb[lVar15 + 1] << (bVar6 & 0x1f);
      lVar15 = lVar15 + 1;
      if (iVar9 <= iVar16) {
        iVar16 = iVar9;
      }
      uVar17 = (~(-1 << (""[cpi->fp_block_size] & 0x1f)) - (*piVar1 << (bVar6 & 0x1f))) + iVar16 >>
               (""[cpi->fp_block_size] & 0x1f);
      if ((int)uVar10 <= (int)uVar17) {
        uVar10 = uVar17;
      }
    } while (lVar18 != lVar15);
  }
  bVar21 = true;
  if (((cpi->mt_info).enc_row_mt.allocated_tile_cols == uVar11) &&
     ((cpi->mt_info).enc_row_mt.allocated_tile_rows == iVar12)) {
    bVar21 = (cpi->mt_info).enc_row_mt.allocated_rows != uVar10;
  }
  if (cpi->allocated_tiles < (int)(uVar11 * iVar12)) {
    av1_alloc_tile_data(cpi);
  }
  if (bVar21) {
    row_mt_mem_alloc(cpi,uVar10,-1,0);
  }
  av1_init_tile_data(cpi);
  uVar17 = (cpi->mt_info).num_mod_workers[0];
  if (uVar17 == 0) {
    uVar17 = av1_fp_compute_num_enc_workers(cpi);
  }
  memset((cpi->mt_info).enc_row_mt.thread_id_to_tile_id,0xff,0x100);
  (cpi->mt_info).enc_row_mt.firstpass_mt_exit = false;
  if (0 < iVar12) {
    lVar19 = 0x5d00;
    lVar15 = 0;
    do {
      uVar13 = (ulong)uVar11;
      lVar20 = lVar19;
      if (0 < (int)uVar11) {
        do {
          pTVar2 = cpi->tile_data;
          memset(*(void **)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x16 + lVar20),0xff,
                 (ulong)uVar10 << 2);
          *(undefined4 *)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x2a + lVar20) =
               *(undefined4 *)((long)pTVar2 + lVar20 + -0x5d00);
          *(undefined4 *)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x2e + lVar20) = 0;
          *(undefined4 *)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x22 + lVar20) = 0;
          lVar20 = lVar20 + 0x5d10;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      lVar15 = lVar15 + 1;
      lVar19 = lVar19 + (ulong)uVar11 * 0x5d10;
    } while (lVar15 != lVar18);
  }
  uVar10 = (cpi->mt_info).num_workers;
  if ((int)uVar17 < (int)uVar10) {
    uVar10 = uVar17;
  }
  uVar13 = (ulong)uVar10;
  if (0 < (int)uVar10) {
    uVar7 = 0;
    iVar9 = 0;
    do {
      (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[uVar7] = iVar9;
      iVar9 = iVar9 + 1;
      if (iVar9 == uVar11 * iVar12) {
        iVar9 = 0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
    if (0 < (int)uVar10) {
      lVar18 = uVar13 + 1;
      lVar15 = uVar13 * 0x1d0;
      lVar19 = uVar13 * 0x38;
      uVar11 = uVar10;
      do {
        uVar11 = uVar11 - 1;
        pAVar14 = (cpi->mt_info).workers;
        pEVar3 = (cpi->mt_info).tile_thr_data;
        pcVar8 = pEVar3[-1].error_info.detail + lVar15 + -0x20;
        *(code **)((long)pAVar14 + lVar19 + -0x20) = fp_enc_row_mt_worker_hook;
        *(char **)((long)pAVar14 + lVar19 + -0x18) = pcVar8;
        *(undefined8 *)((long)pAVar14 + lVar19 + -0x10) = 0;
        *(uint *)((pEVar3->error_info).detail + lVar15 + -0x24) = uVar11;
        *(uint *)((pEVar3->error_info).detail + lVar15 + -0x28) = uVar11;
        *(AV1_COMP **)pcVar8 = cpi;
        if (lVar15 == 0x1d0) {
          pEVar3->td = &cpi->td;
        }
        else {
          __dest = *(void **)((long)pEVar3 + lVar15 + -0x1c0);
          *(void **)((long)pEVar3 + lVar15 + -0x1c8) = __dest;
          memcpy(__dest,&cpi->td,0x256b0);
        }
        av1_alloc_src_diff_buf(&cpi->common,*(macroblock **)((long)pEVar3 + lVar15 + -0x1c8));
        lVar18 = lVar18 + -1;
        lVar15 = lVar15 + -0x1d0;
        lVar19 = lVar19 + -0x38;
      } while (1 < lVar18);
    }
  }
  pAVar5 = aom_get_worker_interface();
  if (0 < (int)uVar10) {
    lVar18 = uVar13 + 1;
    lVar15 = uVar13 * 0x38;
    do {
      pAVar14 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar14[-1].had_error + lVar15) = 0;
      pAVar14 = (AVxWorker *)((long)&pAVar14[-1].impl_ + lVar15);
      if (lVar18 == 2) {
        (*pAVar5->execute)(pAVar14);
      }
      else {
        (*pAVar5->launch)(pAVar14);
      }
      lVar18 = lVar18 + -1;
      lVar15 = lVar15 + -0x38;
    } while (1 < lVar18);
  }
  pAVar5 = aom_get_worker_interface();
  pAVar14 = (cpi->mt_info).workers;
  iVar12 = pAVar14->had_error;
  if (iVar12 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar14->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar10) {
    lVar18 = uVar13 + 1;
    lVar15 = uVar13 * 0x38;
    do {
      pAVar4 = (cpi->mt_info).workers;
      iVar9 = (*pAVar5->sync)((AVxWorker *)((long)&pAVar4[-1].impl_ + lVar15));
      if (iVar9 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar4[-1].data1 + lVar15) + 0x18),0x1a0);
        iVar12 = 1;
      }
      lVar18 = lVar18 + -1;
      lVar15 = lVar15 + -0x38;
    } while (2 < lVar18);
  }
  if (iVar12 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar14->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar10) {
    lVar18 = uVar13 + 1;
    lVar15 = uVar13 * 0x1d0 + -0x1c8;
    do {
      mb = *(macroblock **)((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar15 + -0x20);
      if ((ThreadData_conflict *)mb != &cpi->td) {
        av1_dealloc_src_diff_buf(mb,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
      }
      lVar18 = lVar18 + -1;
      lVar15 = lVar15 + -0x1d0;
    } while (1 < lVar18);
  }
  return;
}

Assistant:

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int num_workers = 0;
  int max_mb_rows = 0;

  max_mb_rows = fp_compute_max_mb_rows(cm, cpi->fp_block_size);
  const bool alloc_row_mt_mem = enc_row_mt->allocated_tile_cols != tile_cols ||
                                enc_row_mt->allocated_tile_rows != tile_rows ||
                                enc_row_mt->allocated_rows != max_mb_rows;
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_mb_rows, -1, 0);
  }

  av1_init_tile_data(cpi);

  // For pass = 1, compute the no. of workers needed. For single-pass encode
  // (pass = 0), no. of workers are already computed.
  if (mt_info->num_mod_workers[MOD_FP] == 0)
    num_workers = av1_fp_compute_num_enc_workers(cpi);
  else
    num_workers = mt_info->num_mod_workers[MOD_FP];

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  enc_row_mt->firstpass_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_mb_rows);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;

      // intraBC mode is not evaluated during first-pass encoding. Hence, no
      // additional top-right delay is required.
      row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
    }
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  fp_prepare_enc_workers(cpi, fp_enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  dealloc_thread_data_src_diff_buf(cpi, num_workers);
}